

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

int worker_trylock_other(__cilkrts_worker *w,__cilkrts_worker *other)

{
  int iVar1;
  __cilkrts_worker *in_RSI;
  int status;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  iVar2 = 0;
  validate_worker((__cilkrts_worker *)0x1170c0);
  iVar1 = __cilkrts_mutex_trylock
                    ((__cilkrts_worker *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),(mutex *)0x1170d7
                    );
  if (iVar1 != 0) {
    if (in_RSI->l->do_not_steal == 0) {
      iVar2 = __cilkrts_mutex_trylock
                        ((__cilkrts_worker *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),
                         (mutex *)0x117104);
    }
    __cilkrts_mutex_unlock(in_RSI,(mutex *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
  }
  return iVar2;
}

Assistant:

static int worker_trylock_other(__cilkrts_worker *w,
                                __cilkrts_worker *other)
{
    int status = 0;

    validate_worker(other);

    /* This protocol guarantees that, after setting the DO_NOT_STEAL
       flag, worker W can enter its critical section after waiting for
       the thief currently in the critical section (if any) and at
       most one other thief.  

       This requirement is overly paranoid, but it should protect us
       against future nonsense from OS implementors.
    */

    /* compete for the right to disturb OTHER */
    if (__cilkrts_mutex_trylock(w, &other->l->steal_lock)) {
        if (other->l->do_not_steal) {
            /* leave it alone */
        } else {
            status = __cilkrts_mutex_trylock(w, &other->l->lock);
        }
        __cilkrts_mutex_unlock(w, &other->l->steal_lock);
    }


    return status;
}